

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

_Bool av1_cnn_predict_img_multi_out
                (uint8_t **dgd,int width,int height,int stride,CNN_CONFIG *cnn_config,
                CNN_THREAD_DATA *thread_data,CNN_MULTI_OUT *output)

{
  long lVar1;
  float *pfVar2;
  size_t __n;
  uint uVar3;
  uint8_t *puVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  void *memblk;
  long lVar8;
  long lVar9;
  float *pfVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int in_height;
  int iVar26;
  int in_width;
  float *inputs [256];
  float *local_838 [257];
  
  uVar15 = (ulong)(uint)height;
  lVar12 = (long)width;
  lVar1 = lVar12 + (long)cnn_config->ext_width * 2;
  uVar3 = cnn_config->layer_config[0].in_channels;
  in_height = height + cnn_config->ext_height * 2;
  in_width = (int)lVar1;
  iVar6 = in_height * in_width;
  memblk = aom_malloc((long)(int)(iVar6 * uVar3) << 2);
  if (memblk == (void *)0x0) {
    _Var5 = false;
  }
  else {
    if (0 < (int)uVar3) {
      lVar17 = (long)in_width;
      __n = lVar17 * 4;
      lVar20 = (long)stride;
      iVar7 = 0;
      uVar19 = 0;
      do {
        lVar9 = (long)iVar7 * 4;
        pfVar2 = (float *)((long)memblk + (long)(iVar6 * (int)uVar19) * 4);
        local_838[uVar19] = pfVar2;
        iVar26 = cnn_config->ext_height;
        lVar13 = (long)(iVar26 * in_width);
        iVar24 = cnn_config->ext_width;
        lVar8 = (long)iVar24;
        if (cnn_config->strict_bounds == 0) {
          lVar18 = (long)iVar26;
          lVar21 = -lVar18;
          if ((int)lVar21 < iVar26 + height) {
            lVar9 = ((lVar9 + lVar13 * 4) - __n * lVar18) + (long)memblk;
            lVar8 = lVar18 * -lVar20 - lVar8;
            iVar11 = iVar24 + width;
            do {
              if (iVar11 != -iVar24 && SBORROW4(iVar11,-iVar24) == iVar11 + iVar24 < 0) {
                puVar4 = dgd[uVar19];
                lVar13 = 0;
                do {
                  *(float *)(lVar9 + lVar13 * 4) = (float)puVar4[lVar13 + lVar8] / 255.0;
                  lVar13 = lVar13 + 1;
                } while (width + iVar24 * 2 != (int)lVar13);
              }
              lVar21 = lVar21 + 1;
              lVar9 = lVar9 + __n;
              lVar8 = lVar8 + lVar20;
            } while (iVar26 + height != (int)lVar21);
          }
        }
        else {
          if (0 < height) {
            lVar18 = lVar9 + lVar8 * 4 + lVar13 * 4 + (long)memblk;
            lVar21 = 0;
            uVar22 = 0;
            do {
              if (0 < width) {
                puVar4 = dgd[uVar19];
                uVar23 = 0;
                do {
                  *(float *)(lVar18 + uVar23 * 4) = (float)puVar4[uVar23 + lVar21] / 255.0;
                  uVar23 = uVar23 + 1;
                } while ((uint)width != uVar23);
              }
              uVar22 = uVar22 + 1;
              lVar18 = lVar18 + __n;
              lVar21 = lVar21 + lVar20;
            } while (uVar22 != uVar15);
          }
          if (0 < height) {
            lVar9 = lVar9 + lVar8 * 4 + lVar13 * 4;
            pfVar14 = (float *)(lVar9 + (long)-iVar24 * 4 + (long)memblk);
            pfVar10 = (float *)((long)memblk + lVar9 + lVar12 * 4);
            uVar22 = 0;
            do {
              if (0 < iVar24) {
                pfVar16 = pfVar14;
                lVar9 = (long)-iVar24;
                do {
                  lVar9 = lVar9 + 1;
                  *pfVar16 = pfVar2[lVar13 + lVar8 + uVar22 * lVar17];
                  pfVar16 = pfVar16 + 1;
                } while ((int)lVar9 != 0);
              }
              if (0 < iVar24) {
                pfVar16 = pfVar10;
                lVar9 = lVar12;
                do {
                  *pfVar16 = pfVar2[lVar13 + lVar8 + lVar12 + uVar22 * lVar17 + -1];
                  lVar9 = lVar9 + 1;
                  pfVar16 = pfVar16 + 1;
                } while (lVar9 < width + iVar24);
              }
              uVar22 = uVar22 + 1;
              pfVar14 = pfVar14 + lVar17;
              pfVar10 = pfVar10 + lVar17;
            } while (uVar22 != uVar15);
          }
          if (0 < iVar26) {
            iVar24 = -in_width * iVar26;
            do {
              memcpy(pfVar2 + lVar13 + lVar8 + (iVar24 - cnn_config->ext_width),
                     pfVar2 + lVar13 + (lVar8 - cnn_config->ext_width),lVar1 * 4);
              iVar24 = iVar24 + in_width;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          uVar22 = uVar15;
          iVar26 = height * in_width;
          if (0 < cnn_config->ext_height) {
            do {
              memcpy(pfVar2 + lVar13 + lVar8 + (iVar26 - cnn_config->ext_width),
                     pfVar2 + lVar13 + lVar8 + ((height + -1) * in_width - cnn_config->ext_width),
                     __n);
              uVar25 = (int)uVar22 + 1;
              uVar22 = (ulong)uVar25;
              iVar26 = iVar26 + in_width;
            } while ((int)uVar25 < cnn_config->ext_height + height);
          }
        }
        uVar19 = uVar19 + 1;
        iVar7 = iVar7 + iVar6;
      } while (uVar19 != uVar3);
    }
    _Var5 = av1_cnn_predict_c(local_838,in_width,in_height,in_width,cnn_config,thread_data,output);
    aom_free(memblk);
  }
  return _Var5;
}

Assistant:

bool av1_cnn_predict_img_multi_out(uint8_t **dgd, int width, int height,
                                   int stride, const CNN_CONFIG *cnn_config,
                                   const CNN_THREAD_DATA *thread_data,
                                   CNN_MULTI_OUT *output) {
  const float max_val = 255.0;

  const int in_width = width + 2 * cnn_config->ext_width;
  const int in_height = height + 2 * cnn_config->ext_height;
  const int in_channels = cnn_config->layer_config[0].in_channels;
  float *inputs[CNN_MAX_CHANNELS];
  float *input_ =
      (float *)aom_malloc(in_width * in_height * in_channels * sizeof(*input_));
  if (!input_) return false;
  const int in_stride = in_width;

  for (int c = 0; c < in_channels; ++c) {
    inputs[c] = input_ + c * in_stride * in_height;
    float *input =
        inputs[c] + cnn_config->ext_height * in_stride + cnn_config->ext_width;

    if (cnn_config->strict_bounds) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
      // extend left and right
      for (int i = 0; i < height; ++i) {
        for (int j = -cnn_config->ext_width; j < 0; ++j)
          input[i * in_stride + j] = input[i * in_stride];
        for (int j = width; j < width + cnn_config->ext_width; ++j)
          input[i * in_stride + j] = input[i * in_stride + width - 1];
      }
      // extend top and bottom
      for (int i = -cnn_config->ext_height; i < 0; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[-cnn_config->ext_width], in_width * sizeof(*input));
      for (int i = height; i < height + cnn_config->ext_height; ++i)
        memcpy(&input[i * in_stride - cnn_config->ext_width],
               &input[(height - 1) * in_stride - cnn_config->ext_width],
               in_width * sizeof(*input));
    } else {
      for (int i = -cnn_config->ext_height; i < height + cnn_config->ext_height;
           ++i)
        for (int j = -cnn_config->ext_width; j < width + cnn_config->ext_width;
             ++j)
          input[i * in_stride + j] = (float)dgd[c][i * stride + j] / max_val;
    }
  }
  bool success = av1_cnn_predict((const float **)inputs, in_width, in_height,
                                 in_stride, cnn_config, thread_data, output);

  aom_free(input_);
  return success;
}